

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

int ctemplate_htmlparser::htmlparser_is_attr_quoted(htmlparser_ctx *ctx)

{
  int iVar1;
  int st;
  htmlparser_ctx *ctx_local;
  
  iVar1 = statemachine_get_state(ctx->statemachine);
  if ((((iVar1 == 0x11) || (iVar1 == 0x12)) || (iVar1 == 0x13)) || (iVar1 == 0x14)) {
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int htmlparser_is_attr_quoted(htmlparser_ctx *ctx) {
  int st = statemachine_get_state(ctx->statemachine);
  if (st == HTMLPARSER_STATE_INT_VALUE_Q_START ||
      st == HTMLPARSER_STATE_INT_VALUE_Q ||
      st == HTMLPARSER_STATE_INT_VALUE_DQ_START ||
      st == HTMLPARSER_STATE_INT_VALUE_DQ)
      return 1;
  else
      return 0;
}